

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecAtt.h
# Opt level: O0

void Vec_AttGrow(Vec_Att_t *p,int nCapMin)

{
  void **local_20;
  int nCapMin_local;
  Vec_Att_t *p_local;
  
  if (p->nCap < nCapMin) {
    if (p->pArrayPtr == (void **)0x0) {
      local_20 = (void **)malloc((long)nCapMin << 3);
    }
    else {
      local_20 = (void **)realloc(p->pArrayPtr,(long)nCapMin << 3);
    }
    p->pArrayPtr = local_20;
    memset(p->pArrayPtr + p->nCap,0,(long)(nCapMin - p->nCap) << 3);
    p->nCap = nCapMin;
  }
  return;
}

Assistant:

static inline void Vec_AttGrow( Vec_Att_t * p, int nCapMin )
{
    if ( p->nCap >= nCapMin )
        return;
    p->pArrayPtr = ABC_REALLOC( void *, p->pArrayPtr, nCapMin );
    memset( p->pArrayPtr + p->nCap, 0, sizeof(void *) * (nCapMin - p->nCap) );
    p->nCap = nCapMin;
}